

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

int xmlRegGetCounter(xmlRegParserCtxtPtr ctxt)

{
  uint uVar1;
  int iVar2;
  xmlRegCounter *pxVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = ctxt->maxCounters;
  iVar2 = ctxt->nbCounters;
  if (iVar2 < (int)uVar1) {
    pxVar3 = ctxt->counters;
LAB_00174229:
    pxVar3[iVar2].min = -1;
    pxVar3[iVar2].max = -1;
    ctxt->nbCounters = iVar2 + 1;
  }
  else {
    if ((int)uVar1 < 1) {
      uVar5 = 4;
LAB_00174204:
      pxVar3 = (xmlRegCounter *)(*xmlRealloc)(ctxt->counters,(ulong)uVar5 << 3);
      if (pxVar3 != (xmlRegCounter *)0x0) {
        ctxt->counters = pxVar3;
        ctxt->maxCounters = uVar5;
        iVar2 = ctxt->nbCounters;
        goto LAB_00174229;
      }
    }
    else if (uVar1 < 1000000000) {
      uVar4 = uVar1 + 1 >> 1;
      uVar5 = uVar4 + uVar1;
      if (1000000000 - uVar4 < uVar1) {
        uVar5 = 1000000000;
      }
      goto LAB_00174204;
    }
    xmlRegexpErrMemory(ctxt);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int
xmlRegGetCounter(xmlRegParserCtxtPtr ctxt) {
    if (ctxt->nbCounters >= ctxt->maxCounters) {
	xmlRegCounter *tmp;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->maxCounters, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
	if (newSize < 0) {
	    xmlRegexpErrMemory(ctxt);
	    return(-1);
	}
	tmp = xmlRealloc(ctxt->counters, newSize * sizeof(tmp[0]));
	if (tmp == NULL) {
	    xmlRegexpErrMemory(ctxt);
	    return(-1);
	}
	ctxt->counters = tmp;
	ctxt->maxCounters = newSize;
    }
    ctxt->counters[ctxt->nbCounters].min = -1;
    ctxt->counters[ctxt->nbCounters].max = -1;
    return(ctxt->nbCounters++);
}